

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

bool __thiscall IRBuilderAsmJs::IsLoopBodyOuterOffset(IRBuilderAsmJs *this,uint offset)

{
  bool bVar1;
  JITTimeWorkItem *pJVar2;
  JITLoopHeaderIDL *pJVar3;
  bool local_29;
  uint offset_local;
  IRBuilderAsmJs *this_local;
  
  bVar1 = IsLoopBody(this);
  if (bVar1) {
    pJVar2 = Func::GetWorkItem(this->m_func);
    pJVar3 = JITTimeWorkItem::GetLoopHeader(pJVar2);
    local_29 = true;
    if (offset < pJVar3->endOffset) {
      pJVar2 = Func::GetWorkItem(this->m_func);
      pJVar3 = JITTimeWorkItem::GetLoopHeader(pJVar2);
      local_29 = offset < pJVar3->startOffset;
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
IRBuilderAsmJs::IsLoopBodyOuterOffset(uint offset) const
{
    if (!IsLoopBody())
    {
        return false;
    }

    return (offset >= m_func->GetWorkItem()->GetLoopHeader()->endOffset || offset < m_func->GetWorkItem()->GetLoopHeader()->startOffset);
}